

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::setState(ZeroDelayObserver *this,StateVector *x_k,TimeIndex k)

{
  IndexedVectorArray *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  
  iVar1 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])();
  if ((char)iVar1 == '\0') {
    __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,8,
                  "virtual void stateObservation::ZeroDelayObserver::setState(const ObserverBase::StateVector &, TimeIndex)"
                 );
  }
  IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::set(&this->x_,x_k,k);
  iVar1 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x22])(this);
  this_00 = &this->y_;
  if (k < CONCAT44(extraout_var,iVar1)) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(this_00);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&this->u_);
    return;
  }
  while( true ) {
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(&(this->y_).v_);
    if (((long)sVar2 < 1) || (k < this_00->k_)) break;
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::popFront(this_00);
  }
  if (0 < (this->super_ObserverBase).p_) {
    while( true ) {
      sVar2 = std::
              deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::size(&(this->u_).v_);
      if (((long)sVar2 < 1) || (k <= (this->u_).k_)) break;
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::popFront(&this->u_);
    }
  }
  return;
}

Assistant:

void ZeroDelayObserver::setState(const ObserverBase::StateVector & x_k, TimeIndex k)
{
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_.set(x_k, k);

  if(k < getCurrentTime())
  {
    y_.clear();
    u_.clear();
  }
  else
  {
    while(y_.size() > 0 && y_.getFirstIndex() <= k)
    {
      y_.popFront();
    }

    if(p_ > 0)
      while(u_.size() > 0 && u_.getFirstIndex() < k)
      {
        u_.popFront();
      }
  }
}